

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MainWindow.cpp
# Opt level: O2

bool __thiscall MainWindow::maybeSave(MainWindow *this)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  QArrayDataPointer<char16_t> local_80;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_50;
  QArrayDataPointer<char16_t> local_38;
  
  bVar1 = Module::isModified(this->mModule);
  bVar3 = true;
  if (bVar1) {
    tr((QString *)&local_50,"Trackerboy",(char *)0x0,-1);
    tr((QString *)&local_80,"Save changes to %1?",(char *)0x0,-1);
    ModuleFile::name((QString *)&local_38,&this->mModuleFile);
    QString::arg((QString *)&local_68,(int)&local_80,(QChar)(char16_t)&local_38);
    iVar2 = QMessageBox::warning(this,&local_50,&local_68,0xc00800,0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    if (iVar2 == 0x800) {
      bVar1 = onFileSave(this);
      if (bVar1) {
        return true;
      }
    }
    else if (iVar2 != 0x400000) {
      return true;
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool MainWindow::maybeSave() {
    if (mModule->isModified()) {
        // prompt the user if they want to save any changes
        auto const result = QMessageBox::warning(
            this,
            tr("Trackerboy"),
            tr("Save changes to %1?").arg(mModuleFile.name()),
            QMessageBox::Save | QMessageBox::Discard | QMessageBox::Cancel
        );

        switch (result) {
            case QMessageBox::Save:
                if (!onFileSave()) {
                    // save failed, do not close document
                    return false;
                }
                break;
            case QMessageBox::Cancel:
                // user cancelled, do not close document
                return false;
            default:
                break;
        }
    }

    return true;
}